

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

int Abc_TgCannonVerify(Abc_TgMan_t *pMan)

{
  int iVar1;
  Abc_TgMan_t *pMan_local;
  
  iVar1 = Abc_TtCannonVerify(pMan->pTruth,pMan->nVars,pMan->pPermT,pMan->uPhase);
  return iVar1;
}

Assistant:

static inline int Abc_TgCannonVerify(Abc_TgMan_t* pMan)
{
    return Abc_TtCannonVerify(pMan->pTruth, pMan->nVars, pMan->pPermT, pMan->uPhase);
}